

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitSelect(BinaryInstWriter *this,Select *curr)

{
  bool bVar1;
  BufferWithRandomAccess *this_00;
  size_t sVar2;
  Type *this_01;
  Type type;
  ulong uVar3;
  
  this_01 = &(curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type;
  bVar1 = wasm::Type::isRef(this_01);
  if (bVar1) {
    this_00 = BufferWithRandomAccess::operator<<(this->o,'\x1c');
    sVar2 = wasm::Type::size(this_01);
    BufferWithRandomAccess::operator<<(this_00,(U32LEB)(uint)sVar2);
    sVar2 = wasm::Type::size(this_01);
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        type.id = 0;
        if (this_01->id != 1) {
          type.id = this_01->id;
        }
        WasmBinaryWriter::writeType(this->parent,type);
        uVar3 = uVar3 + 1;
        sVar2 = wasm::Type::size(this_01);
      } while (uVar3 < sVar2);
    }
    return;
  }
  BufferWithRandomAccess::operator<<(this->o,'\x1b');
  return;
}

Assistant:

void BinaryInstWriter::visitSelect(Select* curr) {
  if (curr->type.isRef()) {
    o << int8_t(BinaryConsts::SelectWithType) << U32LEB(curr->type.size());
    for (size_t i = 0; i < curr->type.size(); i++) {
      parent.writeType(curr->type != Type::unreachable ? curr->type
                                                       : Type::none);
    }
  } else {
    o << int8_t(BinaryConsts::Select);
  }
}